

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::MergedDescriptorDatabaseTest_FindFileContainingExtension_Test::
TestBody(MergedDescriptorDatabaseTest_FindFileContainingExtension_Test *this)

{
  MergedDescriptorDatabase *this_00;
  bool bVar1;
  pointer *__ptr;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr_11;
  MergedDescriptorDatabase *this_01;
  pointer *__ptr_1;
  FileDescriptorProto file;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_158;
  undefined1 local_150 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  AssertHelper local_130;
  Message local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  FileDescriptorProto local_118;
  
  FileDescriptorProto::FileDescriptorProto(&local_118,(Arena *)0x0);
  local_150 = (undefined1  [8])&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"Foo","");
  this_00 = &(this->super_MergedDescriptorDatabaseTest).forward_merged_;
  local_128.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ =
       (internal)
       MergedDescriptorDatabase::FindFileContainingExtension
                 (this_00,(StringViewArg)local_150,3,&local_118);
  local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_150 == (undefined1  [8])&local_140) {
    if (!(bool)local_128.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_) goto LAB_00563c9c;
  }
  else {
    operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    if (((byte)local_128.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_ & 1) == 0) {
LAB_00563c9c:
      testing::Message::Message((Message *)&local_158);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_150,(internal *)&local_128,
                 (AssertionResult *)"forward_merged_.FindFileContainingExtension(\"Foo\", 3, &file)"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x30c,(char *)local_150);
      testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_158);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      if (local_150 != (undefined1  [8])&local_140) {
        operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
      }
      if (local_158._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_158._M_head_impl + 8))();
      }
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)local_150,"\"foo.proto\"","file.name()",(char (*) [10])0x119907e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)local_118.field_0._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
  if (local_150[0] == (string)0x0) {
    testing::Message::Message(&local_128);
    if (local_148 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = (local_148->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x30d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    if ((long *)CONCAT71(local_128.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_128.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_128.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_128.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_148 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_148,local_148);
  }
  local_150 = (undefined1  [8])&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"Foo","");
  ExpectContainsType(&local_118,(string *)local_150);
  if (local_150 != (undefined1  [8])&local_140) {
    operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
  }
  FileDescriptorProto::~FileDescriptorProto(&local_118);
  FileDescriptorProto::FileDescriptorProto(&local_118,(Arena *)0x0);
  local_150 = (undefined1  [8])&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"Bar","");
  local_128.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ =
       (internal)
       MergedDescriptorDatabase::FindFileContainingExtension
                 (this_00,(StringViewArg)local_150,5,&local_118);
  local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_150 == (undefined1  [8])&local_140) {
    if (!(bool)local_128.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_) goto LAB_00563e9f;
  }
  else {
    operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    if (((byte)local_128.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_ & 1) == 0) {
LAB_00563e9f:
      testing::Message::Message((Message *)&local_158);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_150,(internal *)&local_128,
                 (AssertionResult *)"forward_merged_.FindFileContainingExtension(\"Bar\", 5, &file)"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x314,(char *)local_150);
      testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_158);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      if (local_150 != (undefined1  [8])&local_140) {
        operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
      }
      if (local_158._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_158._M_head_impl + 8))();
      }
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)local_150,"\"bar.proto\"","file.name()",(char (*) [10])0x119946a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)local_118.field_0._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
  if (local_150[0] == (string)0x0) {
    testing::Message::Message(&local_128);
    if (local_148 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = (local_148->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x315,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    if ((long *)CONCAT71(local_128.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_128.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_128.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_128.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_148 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_148,local_148);
  }
  local_150 = (undefined1  [8])&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"Bar","");
  ExpectContainsType(&local_118,(string *)local_150);
  if (local_150 != (undefined1  [8])&local_140) {
    operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
  }
  FileDescriptorProto::~FileDescriptorProto(&local_118);
  FileDescriptorProto::FileDescriptorProto(&local_118,(Arena *)0x0);
  local_150 = (undefined1  [8])&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"Baz","");
  local_128.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ =
       (internal)
       MergedDescriptorDatabase::FindFileContainingExtension
                 (this_00,(StringViewArg)local_150,0xc,&local_118);
  local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_150 == (undefined1  [8])&local_140) {
    if (!(bool)local_128.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_) goto LAB_005640a2;
  }
  else {
    operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    if (((byte)local_128.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_ & 1) == 0) {
LAB_005640a2:
      testing::Message::Message((Message *)&local_158);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_150,(internal *)&local_128,
                 (AssertionResult *)
                 "forward_merged_.FindFileContainingExtension(\"Baz\", 12, &file)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x31c,(char *)local_150);
      testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_158);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      if (local_150 != (undefined1  [8])&local_140) {
        operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
      }
      if (local_158._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_158._M_head_impl + 8))();
      }
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)local_150,"\"baz.proto\"","file.name()",(char (*) [10])0x1198bf0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)local_118.field_0._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
  if (local_150[0] == (string)0x0) {
    testing::Message::Message(&local_128);
    if (local_148 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = (local_148->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x31d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    if ((long *)CONCAT71(local_128.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_128.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_128.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_128.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_148 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_148,local_148);
  }
  local_150 = (undefined1  [8])&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"FromPool1","");
  ExpectContainsType(&local_118,(string *)local_150);
  if (local_150 != (undefined1  [8])&local_140) {
    operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
  }
  FileDescriptorProto::~FileDescriptorProto(&local_118);
  FileDescriptorProto::FileDescriptorProto(&local_118,(Arena *)0x0);
  local_150 = (undefined1  [8])&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"Baz","");
  this_01 = &(this->super_MergedDescriptorDatabaseTest).reverse_merged_;
  local_128.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ =
       (internal)
       MergedDescriptorDatabase::FindFileContainingExtension
                 (this_01,(StringViewArg)local_150,0xc,&local_118);
  local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_150 == (undefined1  [8])&local_140) {
    if (!(bool)local_128.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_) goto LAB_005642ac;
  }
  else {
    operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    if (((byte)local_128.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_ & 1) == 0) {
LAB_005642ac:
      testing::Message::Message((Message *)&local_158);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_150,(internal *)&local_128,
                 (AssertionResult *)
                 "reverse_merged_.FindFileContainingExtension(\"Baz\", 12, &file)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x324,(char *)local_150);
      testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_158);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      if (local_150 != (undefined1  [8])&local_140) {
        operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
      }
      if (local_158._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_158._M_head_impl + 8))();
      }
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)local_150,"\"baz.proto\"","file.name()",(char (*) [10])0x1198bf0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)local_118.field_0._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
  if (local_150[0] == (string)0x0) {
    testing::Message::Message(&local_128);
    if (local_148 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = (local_148->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x325,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    if ((long *)CONCAT71(local_128.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_128.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_128.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_128.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_148 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_148,local_148);
  }
  local_150 = (undefined1  [8])&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"FromPool2","");
  ExpectContainsType(&local_118,(string *)local_150);
  if (local_150 != (undefined1  [8])&local_140) {
    operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
  }
  FileDescriptorProto::~FileDescriptorProto(&local_118);
  FileDescriptorProto::FileDescriptorProto(&local_118,(Arena *)0x0);
  local_150 = (undefined1  [8])&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"Baz","");
  local_128.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ =
       (internal)
       MergedDescriptorDatabase::FindFileContainingExtension
                 (this_00,(StringViewArg)local_150,0xd,&local_118);
  local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_150 == (undefined1  [8])&local_140) {
    if (!(bool)local_128.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_) goto LAB_005644af;
  }
  else {
    operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    if (((byte)local_128.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_ & 1) == 0) {
LAB_005644af:
      testing::Message::Message((Message *)&local_158);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_150,(internal *)&local_128,
                 (AssertionResult *)
                 "forward_merged_.FindFileContainingExtension(\"Baz\", 13, &file)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x32d,(char *)local_150);
      testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_158);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      if (local_150 != (undefined1  [8])&local_140) {
        operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
      }
      if (local_158._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_158._M_head_impl + 8))();
      }
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  local_150 = (undefined1  [8])&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"Baz","");
  bVar1 = MergedDescriptorDatabase::FindFileContainingExtension
                    (this_01,(StringViewArg)local_150,0xd,&local_118);
  local_128.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)!bVar1;
  local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_150 == (undefined1  [8])&local_140) {
    if (!bVar1) goto LAB_00564645;
  }
  else {
    operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    if (((byte)local_128.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_ & 1) != 0) goto LAB_00564645;
  }
  testing::Message::Message((Message *)&local_158);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_150,(internal *)&local_128,
             (AssertionResult *)"reverse_merged_.FindFileContainingExtension(\"Baz\", 13, &file)",
             "true","false",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_130,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
             ,0x32e,(char *)local_150);
  testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_158);
  testing::internal::AssertHelper::~AssertHelper(&local_130);
  if (local_150 != (undefined1  [8])&local_140) {
    operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
  }
  if (local_158._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_158._M_head_impl + 8))();
  }
LAB_00564645:
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  FileDescriptorProto::~FileDescriptorProto(&local_118);
  FileDescriptorProto::FileDescriptorProto(&local_118,(Arena *)0x0);
  local_150 = (undefined1  [8])&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"Foo","");
  bVar1 = MergedDescriptorDatabase::FindFileContainingExtension
                    (this_00,(StringViewArg)local_150,6,&local_118);
  local_128.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)!bVar1;
  local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_150 != (undefined1  [8])&local_140) {
    operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
  }
  if (bVar1) {
    testing::Message::Message((Message *)&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)&local_128,
               (AssertionResult *)"forward_merged_.FindFileContainingExtension(\"Foo\", 6, &file)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x334,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if (local_158._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_158._M_head_impl + 8))();
    }
    if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_120,local_120);
    }
  }
  FileDescriptorProto::~FileDescriptorProto(&local_118);
  return;
}

Assistant:

TEST_F(MergedDescriptorDatabaseTest, FindFileContainingExtension) {
  {
    // Can find file that is only in database1_.
    FileDescriptorProto file;
    EXPECT_TRUE(forward_merged_.FindFileContainingExtension("Foo", 3, &file));
    EXPECT_EQ("foo.proto", file.name());
    ExpectContainsType(file, "Foo");
  }

  {
    // Can find file that is only in database2_.
    FileDescriptorProto file;
    EXPECT_TRUE(forward_merged_.FindFileContainingExtension("Bar", 5, &file));
    EXPECT_EQ("bar.proto", file.name());
    ExpectContainsType(file, "Bar");
  }

  {
    // In forward_merged_, database1_'s baz.proto takes precedence.
    FileDescriptorProto file;
    EXPECT_TRUE(forward_merged_.FindFileContainingExtension("Baz", 12, &file));
    EXPECT_EQ("baz.proto", file.name());
    ExpectContainsType(file, "FromPool1");
  }

  {
    // In reverse_merged_, database2_'s baz.proto takes precedence.
    FileDescriptorProto file;
    EXPECT_TRUE(reverse_merged_.FindFileContainingExtension("Baz", 12, &file));
    EXPECT_EQ("baz.proto", file.name());
    ExpectContainsType(file, "FromPool2");
  }

  {
    // Baz's extension 13 only shows up in forward_merged_ because it is
    // masked by database2_'s baz.proto in reverse_merged_.
    FileDescriptorProto file;
    EXPECT_TRUE(forward_merged_.FindFileContainingExtension("Baz", 13, &file));
    EXPECT_FALSE(reverse_merged_.FindFileContainingExtension("Baz", 13, &file));
  }

  {
    // Can't find non-existent extension.
    FileDescriptorProto file;
    EXPECT_FALSE(forward_merged_.FindFileContainingExtension("Foo", 6, &file));
  }
}